

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglMemoryStressTests.cpp
# Opt level: O0

bool __thiscall
deqp::egl::anon_unknown_0::MemoryAllocator::allocateUntilFailure(MemoryAllocator *this)

{
  ObjectType OVar1;
  size_type sVar2;
  iterator first;
  iterator last;
  deUint64 dVar3;
  value_type local_58;
  ObjectType type;
  value_type local_44;
  undefined1 local_40 [8];
  vector<deqp::egl::(anonymous_namespace)::ObjectType,_std::allocator<deqp::egl::(anonymous_namespace)::ObjectType>_>
  types;
  deUint64 beginTimeUs;
  deUint64 timeLimitUs;
  MemoryAllocator *this_local;
  
  types.
  super__Vector_base<deqp::egl::(anonymous_namespace)::ObjectType,_std::allocator<deqp::egl::(anonymous_namespace)::ObjectType>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)deGetMicroseconds();
  std::
  vector<deqp::egl::(anonymous_namespace)::ObjectType,_std::allocator<deqp::egl::(anonymous_namespace)::ObjectType>_>
  ::vector((vector<deqp::egl::(anonymous_namespace)::ObjectType,_std::allocator<deqp::egl::(anonymous_namespace)::ObjectType>_>
            *)local_40);
  if ((this->m_types & OBJECTTYPE_CONTEXT) != 0) {
    local_44 = OBJECTTYPE_CONTEXT;
    std::
    vector<deqp::egl::(anonymous_namespace)::ObjectType,_std::allocator<deqp::egl::(anonymous_namespace)::ObjectType>_>
    ::push_back((vector<deqp::egl::(anonymous_namespace)::ObjectType,_std::allocator<deqp::egl::(anonymous_namespace)::ObjectType>_>
                 *)local_40,&local_44);
  }
  if ((this->m_types & OBJECTTYPE_PBUFFER) != 0) {
    local_58 = OBJECTTYPE_PBUFFER;
    std::
    vector<deqp::egl::(anonymous_namespace)::ObjectType,_std::allocator<deqp::egl::(anonymous_namespace)::ObjectType>_>
    ::push_back((vector<deqp::egl::(anonymous_namespace)::ObjectType,_std::allocator<deqp::egl::(anonymous_namespace)::ObjectType>_>
                 *)local_40,&local_58);
  }
  sVar2 = std::vector<void_*,_std::allocator<void_*>_>::size(&this->m_contexts);
  if (((sVar2 == 0) &&
      (sVar2 = std::vector<void_*,_std::allocator<void_*>_>::size(&this->m_pbuffers), sVar2 == 0))
     && ((this->m_use & 1U) != 0)) {
    allocateContext(this);
    allocatePBuffer(this);
  }
  do {
    if (((this->m_failed ^ 0xffU) & 1) == 0) {
      this_local._7_1_ = false;
      goto LAB_0177ad92;
    }
    first = std::
            vector<deqp::egl::(anonymous_namespace)::ObjectType,_std::allocator<deqp::egl::(anonymous_namespace)::ObjectType>_>
            ::begin((vector<deqp::egl::(anonymous_namespace)::ObjectType,_std::allocator<deqp::egl::(anonymous_namespace)::ObjectType>_>
                     *)local_40);
    last = std::
           vector<deqp::egl::(anonymous_namespace)::ObjectType,_std::allocator<deqp::egl::(anonymous_namespace)::ObjectType>_>
           ::end((vector<deqp::egl::(anonymous_namespace)::ObjectType,_std::allocator<deqp::egl::(anonymous_namespace)::ObjectType>_>
                  *)local_40);
    OVar1 = de::Random::
            choose<deqp::egl::(anonymous_namespace)::ObjectType,__gnu_cxx::__normal_iterator<deqp::egl::(anonymous_namespace)::ObjectType*,std::vector<deqp::egl::(anonymous_namespace)::ObjectType,std::allocator<deqp::egl::(anonymous_namespace)::ObjectType>>>>
                      (&this->m_rnd,
                       (__normal_iterator<deqp::egl::(anonymous_namespace)::ObjectType_*,_std::vector<deqp::egl::(anonymous_namespace)::ObjectType,_std::allocator<deqp::egl::(anonymous_namespace)::ObjectType>_>_>
                        )first._M_current,
                       (__normal_iterator<deqp::egl::(anonymous_namespace)::ObjectType_*,_std::vector<deqp::egl::(anonymous_namespace)::ObjectType,_std::allocator<deqp::egl::(anonymous_namespace)::ObjectType>_>_>
                        )last._M_current);
    if (OVar1 == OBJECTTYPE_PBUFFER) {
      allocatePBuffer(this);
    }
    else if (OVar1 == OBJECTTYPE_CONTEXT) {
      allocateContext(this);
    }
    dVar3 = deGetMicroseconds();
  } while ((char *)(dVar3 - (long)types.
                                  super__Vector_base<deqp::egl::(anonymous_namespace)::ObjectType,_std::allocator<deqp::egl::(anonymous_namespace)::ObjectType>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage) <=
           "3ExtensionInfoESt4lessIS8_ESaIS8_EEESt10_Select1stISD_ES9_IS3_ESaISD_EE9_M_mbeginEv");
  this_local._7_1_ = true;
LAB_0177ad92:
  std::
  vector<deqp::egl::(anonymous_namespace)::ObjectType,_std::allocator<deqp::egl::(anonymous_namespace)::ObjectType>_>
  ::~vector((vector<deqp::egl::(anonymous_namespace)::ObjectType,_std::allocator<deqp::egl::(anonymous_namespace)::ObjectType>_>
             *)local_40);
  return this_local._7_1_;
}

Assistant:

bool MemoryAllocator::allocateUntilFailure (void)
{
	const deUint64		timeLimitUs		= 10000000; // 10s
	deUint64			beginTimeUs		= deGetMicroseconds();
	vector<ObjectType>	types;

	if ((m_types & OBJECTTYPE_CONTEXT) != 0)
		types.push_back(OBJECTTYPE_CONTEXT);

	if ((m_types & OBJECTTYPE_PBUFFER) != 0)
		types.push_back(OBJECTTYPE_PBUFFER);

	// If objects should be used. Create one of both at beginning to allow using them.
	if (m_contexts.size() == 0 && m_pbuffers.size() == 0 && m_use)
	{
		allocateContext();
		allocatePBuffer();
	}

	while (!m_failed)
	{
		ObjectType type = m_rnd.choose<ObjectType>(types.begin(), types.end());

		switch (type)
		{
			case OBJECTTYPE_PBUFFER:
				allocatePBuffer();
				break;

			case OBJECTTYPE_CONTEXT:
				allocateContext();
				break;

			default:
				DE_ASSERT(false);
		}

		if (deGetMicroseconds() - beginTimeUs > timeLimitUs)
			return true;
	}

	return false;
}